

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLargeDataWindowOffsets.cpp
# Opt level: O0

void anon_unknown.dwarf_13f597::readfile(FrameBuffer *buf,char **channels,PixelType *pt)

{
  int iVar1;
  char *pcVar2;
  long lVar3;
  InputFile infile;
  bool in_stack_0000008f;
  FrameBuffer *in_stack_00000090;
  PixelType *in_stack_00000098;
  undefined4 in_stack_ffffffffffffff50;
  FrameBuffer local_38;
  
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile((InputFile *)&local_38,pcVar2,iVar1);
  Imf_3_4::InputFile::header();
  setupBuffer((Header *)channels,(char **)pt,in_stack_00000098,in_stack_00000090,in_stack_0000008f);
  Imf_3_4::ChannelList::~ChannelList((ChannelList *)0x1ae8a5);
  Imf_3_4::InputFile::setFrameBuffer(&local_38);
  Imf_3_4::InputFile::header();
  lVar3 = Imf_3_4::Header::dataWindow();
  iVar1 = *(int *)(lVar3 + 4);
  Imf_3_4::InputFile::header();
  Imf_3_4::Header::dataWindow();
  Imf_3_4::InputFile::readPixels((int)&local_38,iVar1);
  Imf_3_4::InputFile::~InputFile((InputFile *)CONCAT44(iVar1,in_stack_ffffffffffffff50));
  return;
}

Assistant:

void
readfile (
    FrameBuffer& buf, ///< list of channels to read: index to readingBuffer,
    const char* const* channels, // NULL terminated list of channels to write
    const PixelType*   pt)
{
    InputFile infile (filename.c_str ());
    setupBuffer (infile.header (), channels, pt, buf, false);
    infile.setFrameBuffer (buf);

    infile.readPixels (
        infile.header ().dataWindow ().min.y,
        infile.header ().dataWindow ().max.y);
}